

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMulti.c
# Opt level: O1

DdNode * Abc_NtkMultiDeriveBdd_rec(DdManager *dd,Abc_Obj_t *pNode,Vec_Ptr_t *vFanins)

{
  uint uVar1;
  void **ppvVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *n;
  int iVar5;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                  ,0x107,"DdNode *Abc_NtkMultiDeriveBdd_rec(DdManager *, Abc_Obj_t *, Vec_Ptr_t *)")
    ;
  }
  if ((*(uint *)&pNode->field_0x14 & 0x40) != 0) {
    if ((DdNode *)(pNode->field_5).pData != (DdNode *)0x0) {
      return (DdNode *)(pNode->field_5).pData;
    }
    __assert_fail("pNode->pData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                  ,0x10b,"DdNode *Abc_NtkMultiDeriveBdd_rec(DdManager *, Abc_Obj_t *, Vec_Ptr_t *)")
    ;
  }
  *(uint *)&pNode->field_0x14 = *(uint *)&pNode->field_0x14 | 0x40;
  uVar1 = vFanins->nCap;
  if (vFanins->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vFanins->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(0x80);
      }
      else {
        ppvVar2 = (void **)realloc(vFanins->pArray,0x80);
      }
      vFanins->pArray = ppvVar2;
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar1 * 2;
      if (iVar5 <= (int)uVar1) goto LAB_002d8550;
      if (vFanins->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar2 = (void **)realloc(vFanins->pArray,(ulong)uVar1 << 4);
      }
      vFanins->pArray = ppvVar2;
    }
    vFanins->nCap = iVar5;
  }
LAB_002d8550:
  iVar5 = vFanins->nSize;
  vFanins->nSize = iVar5 + 1;
  vFanins->pArray[iVar5] = pNode;
  pDVar3 = Abc_NtkMultiDeriveBdd_rec
                     (dd,(Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],vFanins);
  Cudd_Ref(pDVar3);
  pDVar4 = Abc_NtkMultiDeriveBdd_rec
                     (dd,(Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]],vFanins
                     );
  Cudd_Ref(pDVar4);
  pDVar3 = (DdNode *)((ulong)(*(uint *)&pNode->field_0x14 >> 10 & 1) ^ (ulong)pDVar3);
  pDVar4 = (DdNode *)((ulong)(*(uint *)&pNode->field_0x14 >> 0xb & 1) ^ (ulong)pDVar4);
  n = Cudd_bddAnd(dd,pDVar3,pDVar4);
  Cudd_Ref(n);
  Cudd_RecursiveDeref(dd,pDVar3);
  Cudd_RecursiveDeref(dd,pDVar4);
  (pNode->field_5).pData = n;
  if (n != (DdNode *)0x0) {
    return n;
  }
  __assert_fail("pNode->pData",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                ,0x11c,"DdNode *Abc_NtkMultiDeriveBdd_rec(DdManager *, Abc_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

DdNode * Abc_NtkMultiDeriveBdd_rec( DdManager * dd, Abc_Obj_t * pNode, Vec_Ptr_t * vFanins )
{
    DdNode * bFunc, * bFunc0, * bFunc1;
    assert( !Abc_ObjIsComplement(pNode) );
    // if the result is available return
    if ( pNode->fMarkC )
    {
        assert( pNode->pData ); // network has a cycle
        return (DdNode *)pNode->pData;
    }
    // mark the node as visited
    pNode->fMarkC = 1;
    Vec_PtrPush( vFanins, pNode );
    // compute the result for both branches
    bFunc0 = Abc_NtkMultiDeriveBdd_rec( dd, Abc_ObjFanin(pNode,0), vFanins ); Cudd_Ref( bFunc0 );
    bFunc1 = Abc_NtkMultiDeriveBdd_rec( dd, Abc_ObjFanin(pNode,1), vFanins ); Cudd_Ref( bFunc1 );
    bFunc0 = Cudd_NotCond( bFunc0, (long)Abc_ObjFaninC0(pNode) );
    bFunc1 = Cudd_NotCond( bFunc1, (long)Abc_ObjFaninC1(pNode) );
    // get the final result
    bFunc = Cudd_bddAnd( dd, bFunc0, bFunc1 );   Cudd_Ref( bFunc );
    Cudd_RecursiveDeref( dd, bFunc0 );
    Cudd_RecursiveDeref( dd, bFunc1 );
    // set the result
    pNode->pData = bFunc;
    assert( pNode->pData );
    return bFunc;
}